

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O3

faidx_t * fai_build_core(BGZF *bgzf)

{
  char cVar1;
  uint uVar2;
  faidx_t *idx;
  kh_s_t *pkVar3;
  ushort **ppuVar4;
  char *name;
  long lVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  uint local_60;
  int local_5c;
  uint64_t local_48;
  
  idx = (faidx_t *)calloc(1,0x20);
  pkVar3 = (kh_s_t *)calloc(1,0x28);
  idx->hash = pkVar3;
  lVar5 = -1;
  local_5c = -1;
  iVar9 = 0;
  name = (char *)0x0;
  local_60 = 0xffffffff;
  cVar8 = '\0';
  local_48 = 0;
LAB_00139993:
  do {
    while( true ) {
      uVar2 = bgzf_getc(bgzf);
      if ((int)uVar2 < 0) {
        if (name == (char *)0x0) {
          free(idx);
          return (faidx_t *)0x0;
        }
        fai_insert_index(idx,name,(int)lVar5,local_5c,local_60,local_48);
        free(name);
        return idx;
      }
      if (uVar2 != 10) break;
      if (cVar8 == '\x01') {
        local_48 = bgzf_utell(bgzf);
        cVar8 = '\x01';
        goto LAB_00139993;
      }
      if (cVar8 != '\x02' && (cVar8 != '\0' || -1 < lVar5)) goto LAB_001399f2;
    }
    if (uVar2 != 0x3e) break;
    if (-1 < lVar5) {
      fai_insert_index(idx,name,(int)lVar5,local_5c,local_60,local_48);
    }
    uVar2 = bgzf_getc(bgzf);
    if ((int)uVar2 < 0) goto LAB_00139bdf;
    ppuVar4 = __ctype_b_loc();
    uVar6 = 0;
    while ((*(byte *)((long)*ppuVar4 + (ulong)uVar2 * 2 + 1) & 0x20) == 0) {
      if (iVar9 < (int)uVar6 + 2) {
        uVar10 = (int)uVar6 + 1;
        uVar10 = uVar10 >> 1 | uVar10;
        uVar10 = uVar10 >> 2 | uVar10;
        uVar10 = uVar10 >> 4 | uVar10;
        uVar10 = uVar10 >> 8 | uVar10;
        iVar9 = (uVar10 >> 0x10 | uVar10) + 1;
        name = (char *)realloc(name,(long)iVar9);
      }
      name[uVar6] = (char)uVar2;
      uVar2 = bgzf_getc(bgzf);
      uVar6 = uVar6 + 1;
      if ((int)uVar2 < 0) {
LAB_00139bdf:
        fai_build_core_cold_1();
        return (faidx_t *)0x0;
      }
    }
    name[uVar6 & 0xffffffff] = '\0';
    do {
      if (uVar2 == 10) break;
      uVar2 = bgzf_getc(bgzf);
    } while (-1 < (int)uVar2);
    local_48 = bgzf_utell(bgzf);
    cVar8 = '\x01';
    lVar5 = 0;
  } while( true );
LAB_001399f2:
  if (cVar8 == '\x03') {
    fai_build_core_cold_3();
    return (faidx_t *)0x0;
  }
  uVar10 = 0;
  iVar7 = 1;
  ppuVar4 = __ctype_b_loc();
  do {
    uVar10 = ((*ppuVar4)[uVar2] >> 0xf) + uVar10;
    uVar2 = bgzf_getc(bgzf);
    iVar7 = iVar7 + 1;
    if ((int)uVar2 < 0) break;
  } while (uVar2 != 10);
  cVar1 = cVar8;
  if (cVar8 == '\x02') {
    cVar1 = '\x03';
  }
  if ((cVar1 == '\x03') && (uVar10 != 0)) {
    fai_build_core_cold_2();
    return (faidx_t *)0x0;
  }
  lVar5 = lVar5 + (ulong)uVar10;
  if (cVar8 == '\0') {
    cVar8 = (uVar10 != local_60 || iVar7 != local_5c) * '\x02';
  }
  else {
    bVar11 = cVar8 == '\x01';
    cVar8 = cVar1;
    if (bVar11) {
      cVar8 = '\0';
      local_60 = uVar10;
      local_5c = iVar7;
    }
  }
  goto LAB_00139993;
}

Assistant:

faidx_t *fai_build_core(BGZF *bgzf)
{
    char *name;
    int c;
    int l_name, m_name;
    int line_len, line_blen, state;
    int l1, l2;
    faidx_t *idx;
    uint64_t offset;
    int64_t len;

    idx = (faidx_t*)calloc(1, sizeof(faidx_t));
    idx->hash = kh_init(s);
    name = 0; l_name = m_name = 0;
    len = line_len = line_blen = -1; state = 0; l1 = l2 = -1; offset = 0;
    while ( (c=bgzf_getc(bgzf))>=0 ) {
        if (c == '\n') { // an empty line
            if (state == 1) {
                offset = bgzf_utell(bgzf);
                continue;
            } else if ((state == 0 && len < 0) || state == 2) continue;
        }
        if (c == '>') { // fasta header
            if (len >= 0)
                fai_insert_index(idx, name, len, line_len, line_blen, offset);
            l_name = 0;
            while ( (c=bgzf_getc(bgzf))>=0 && !isspace(c)) {
                if (m_name < l_name + 2) {
                    m_name = l_name + 2;
                    kroundup32(m_name);
                    name = (char*)realloc(name, m_name);
                }
                name[l_name++] = c;
            }
            name[l_name] = '\0';
            if ( c<0 ) {
                fprintf(stderr, "[fai_build_core] the last entry has no sequence\n");
                free(name); fai_destroy(idx);
                return 0;
            }
            if (c != '\n') while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            state = 1; len = 0;
            offset = bgzf_utell(bgzf);
        } else {
            if (state == 3) {
                fprintf(stderr, "[fai_build_core] inlined empty line is not allowed in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            if (state == 2) state = 3;
            l1 = l2 = 0;
            do {
                ++l1;
                if (isgraph(c)) ++l2;
            } while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            if (state == 3 && l2) {
                fprintf(stderr, "[fai_build_core] different line length in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            ++l1; len += l2;
            if (state == 1) line_len = l1, line_blen = l2, state = 0;
            else if (state == 0) {
                if (l1 != line_len || l2 != line_blen) state = 2;
            }
        }
    }
    if ( name )
        fai_insert_index(idx, name, len, line_len, line_blen, offset);
    else
    {
        free(idx);
        return NULL;
    }
    free(name);
    return idx;
}